

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONState.cxx
# Opt level: O0

void __thiscall cmJSONState::AddErrorAtOffset(cmJSONState *this,string *errMsg,ptrdiff_t offset)

{
  ulong uVar1;
  Location local_28;
  Location loc;
  ptrdiff_t offset_local;
  string *errMsg_local;
  cmJSONState *this_local;
  
  loc = (Location)offset;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_28 = LocateInDocument(this,(ptrdiff_t)loc);
    std::vector<cmJSONState::Error,std::allocator<cmJSONState::Error>>::
    emplace_back<cmJSONState::Location&,std::__cxx11::string_const&>
              ((vector<cmJSONState::Error,std::allocator<cmJSONState::Error>> *)&this->errors,
               &local_28,errMsg);
  }
  else {
    AddError(this,errMsg);
  }
  return;
}

Assistant:

void cmJSONState::AddErrorAtOffset(std::string const& errMsg,
                                   std::ptrdiff_t offset)
{
  if (doc.empty()) {
    this->AddError(errMsg);
  } else {
    Location loc = LocateInDocument(offset);
    this->errors.emplace_back(loc, errMsg);
  }
}